

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_streams_blocked
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  quicly_maxsender_t *m_00;
  long in_RCX;
  int in_EDX;
  long in_RDI;
  st_quicly_max_streams_t *m;
  quicly_conn_t *conn;
  
  if (*(int *)(in_RCX + 8) == 0) {
    m_00 = (quicly_maxsender_t *)(in_RDI + 0x98);
  }
  else {
    m_00 = (quicly_maxsender_t *)(in_RDI + 0x70);
  }
  if (in_EDX == 0) {
    quicly_maxsender_lost(m_00,(quicly_maxsender_sent_t *)m_00);
  }
  else {
    quicly_maxsender_acked(m_00,(quicly_maxsender_sent_t *)m_00);
  }
  return 0;
}

Assistant:

static int on_ack_streams_blocked(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    struct st_quicly_max_streams_t *m =
        sent->data.streams_blocked.uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi;

    if (acked) {
        quicly_maxsender_acked(&m->blocked_sender, &sent->data.streams_blocked.args);
    } else {
        quicly_maxsender_lost(&m->blocked_sender, &sent->data.streams_blocked.args);
    }

    return 0;
}